

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_adj.c
# Opt level: O1

REF_STATUS ref_adj_remove(REF_ADJ ref_adj,REF_INT node,REF_INT reference)

{
  REF_ADJ_ITEM pRVar1;
  int iVar2;
  ulong uVar3;
  REF_STATUS RVar4;
  ulong uVar5;
  REF_INT RVar6;
  
  iVar2 = -1;
  if ((-1 < node) && (node < ref_adj->nnode)) {
    iVar2 = ref_adj->first[(uint)node];
  }
  RVar4 = 3;
  if (iVar2 != -1) {
    pRVar1 = ref_adj->item;
    if (pRVar1[iVar2].ref == reference) {
      ref_adj->first[node] = pRVar1[iVar2].next;
      pRVar1[iVar2].next = ref_adj->blank;
      ref_adj->blank = iVar2;
      pRVar1[iVar2].ref = -1;
LAB_001b51b5:
      RVar4 = 0;
    }
    else {
      uVar3 = 0xffffffff;
      if ((-1 < node) && (uVar3 = 0xffffffff, node < ref_adj->nnode)) {
        uVar3 = (ulong)(uint)ref_adj->first[(uint)node];
      }
      if ((int)uVar3 != -1) {
        RVar6 = pRVar1[(int)uVar3].ref;
        uVar5 = 0xffffffff;
        do {
          iVar2 = (int)uVar3;
          if (RVar6 == reference) {
            if ((int)uVar5 == -1) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adj.c"
                     ,0xba,"ref_adj_remove",1,"parent empty");
              return 1;
            }
            pRVar1[(int)uVar5].next = pRVar1[iVar2].next;
            pRVar1[iVar2].next = ref_adj->blank;
            ref_adj->blank = iVar2;
            pRVar1[iVar2].ref = -1;
            goto LAB_001b51b5;
          }
          uVar5 = uVar3 & 0xffffffff;
          uVar3 = (ulong)pRVar1[iVar2].next;
          if (uVar3 == 0xffffffffffffffff) {
            RVar6 = -1;
          }
          else {
            RVar6 = pRVar1[uVar3].ref;
          }
        } while (pRVar1[iVar2].next != -1);
      }
    }
  }
  return RVar4;
}

Assistant:

REF_FCN REF_STATUS ref_adj_remove(REF_ADJ ref_adj, REF_INT node,
                                  REF_INT reference) {
  REF_INT item, ref;
  REF_INT target, parent;

  item = ref_adj_first(ref_adj, node);

  if (!ref_adj_valid(item)) return REF_INVALID;

  if (reference == ref_adj_item_ref(ref_adj, item)) {
    ref_adj->first[node] = ref_adj_item_next(ref_adj, item);
    ref_adj_item_next(ref_adj, item) = ref_adj_blank(ref_adj);
    ref_adj_blank(ref_adj) = item;
    ref_adj_item_ref(ref_adj, item) = REF_EMPTY;
    return REF_SUCCESS;
  }

  target = REF_EMPTY;
  parent = REF_EMPTY;
  each_ref_adj_node_item_with_ref(ref_adj, node, item, ref) {
    if (ref == reference) {
      target = item;
      break;
    } else {
      parent = item;
    }
  }

  if (REF_EMPTY == target) return REF_INVALID;

  if (REF_EMPTY == parent) RSS(REF_FAILURE, "parent empty");

  ref_adj_item_next(ref_adj, parent) = ref_adj_item_next(ref_adj, item);
  ref_adj_item_next(ref_adj, item) = ref_adj_blank(ref_adj);
  ref_adj_blank(ref_adj) = item;
  ref_adj_item_ref(ref_adj, item) = REF_EMPTY;

  return REF_SUCCESS;
}